

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

optional<bool> __thiscall tinyusdz::primvar::PrimVar::is_ts_value_blocked(PrimVar *this,size_t idx)

{
  TimeSamples *this_00;
  pointer pSVar1;
  pointer pSVar2;
  ulong in_RDX;
  ulong uVar3;
  
  pSVar1 = *(pointer *)(idx + 0x20);
  pSVar2 = *(pointer *)(idx + 0x28);
  if (pSVar2 != pSVar1) {
    this_00 = (TimeSamples *)(idx + 0x20);
    if (*(char *)(idx + 0x38) == '\x01') {
      tinyusdz::value::TimeSamples::update(this_00);
      pSVar1 = *(pointer *)(idx + 0x20);
      pSVar2 = *(pointer *)(idx + 0x28);
    }
    uVar3 = ((long)pSVar2 - (long)pSVar1 >> 3) * -0x3333333333333333;
    if (in_RDX <= uVar3 && uVar3 - in_RDX != 0) {
      if (*(char *)(idx + 0x38) == '\x01') {
        tinyusdz::value::TimeSamples::update(this_00);
        pSVar1 = (this_00->_samples).
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined1 *)&(this->_value).v_.storage = 1;
      *(bool *)((long)&(this->_value).v_.storage + 1) = pSVar1[in_RDX].blocked;
      goto LAB_00285530;
    }
  }
  *(undefined2 *)&(this->_value).v_.storage = 0;
LAB_00285530:
  return SUB82(this,0);
}

Assistant:

nonstd::optional<bool> is_ts_value_blocked(size_t idx) const {

    if (!has_timesamples()) {
      return nonstd::nullopt;
    }

    if (idx >= _ts.get_samples().size()) {
      return nonstd::nullopt;
    }

    return _ts.get_samples()[idx].blocked;
  }